

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputParser.cpp
# Opt level: O0

string * __thiscall
InputParser::removeQuotes(string *__return_storage_ptr__,InputParser *this,string *sentence)

{
  char *pcVar1;
  string local_58 [55];
  undefined1 local_21;
  string *local_20;
  string *sentence_local;
  InputParser *this_local;
  string *ret;
  
  local_21 = 0;
  local_20 = sentence;
  sentence_local = (string *)this;
  this_local = (InputParser *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)sentence);
  pcVar1 = (char *)std::__cxx11::string::at((ulong)__return_storage_ptr__);
  if (*pcVar1 == '\"') {
    std::__cxx11::string::size();
    pcVar1 = (char *)std::__cxx11::string::at((ulong)__return_storage_ptr__);
    if (*pcVar1 == '\"') {
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)local_58,(ulong)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_58);
      std::__cxx11::string::~string(local_58);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string InputParser::removeQuotes(const string &sentence) {
    string ret(sentence);

    if (ret.at(0) == '"' && ret.at(ret.size()-1) == '"')
        ret = ret.substr(1, ret.size()-2);

   return ret;
}